

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O2

void __thiscall BaseUser::setPassword(BaseUser *this,string *_password)

{
  int i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < _password->_M_string_length; uVar1 = uVar1 + 1) {
    this->password[uVar1] = (_password->_M_dataplus)._M_p[uVar1];
  }
  this->password[_password->_M_string_length] = '\0';
  return;
}

Assistant:

void BaseUser::setPassword(const string &_password) {
    for (int i = 0; i < _password.size(); ++i) {
        password[i] = _password[i];
    }
    password[_password.size()] = '\0';
}